

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

Catch * __thiscall Catch::toString_abi_cxx11_(Catch *this,float value)

{
  Catch local_38 [36];
  float local_14;
  Catch *pCStack_10;
  float value_local;
  
  local_14 = value;
  pCStack_10 = this;
  fpToString<float>(local_38,value,5);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                 (char *)local_38);
  std::__cxx11::string::~string((string *)local_38);
  return this;
}

Assistant:

std::string toString( const float value ) {
    return fpToString( value, 5 ) + "f";
}